

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O3

void __thiscall Personality::~Personality(Personality *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  list<Follower_*,_std::allocator<Follower_*>_> *this_00;
  list<Item_*,_std::allocator<Item_*>_> *this_01;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001182e0;
  this_00 = &this->followers;
  p_Var4 = (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)this_00) {
    std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::remove
              (this_00,(char *)(p_Var4 + 1));
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))();
    }
    p_Var4 = ((this_00->super__List_base<Follower_*,_std::allocator<Follower_*>_>)._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
  }
  this_01 = &this->items;
  p_Var4 = (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var2 = p_Var4;
  while (p_Var2 != (_List_node_base *)this_01) {
    std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::remove(this_01,(char *)(p_Var2 + 1));
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x18))();
    }
    p_Var4 = (this_01->super__List_base<Item_*,_std::allocator<Item_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var2 = p_Var4->_M_next;
  }
  while (p_Var4 != (_List_node_base *)this_01) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  p_Var4 = (this_00->super__List_base<Follower_*,_std::allocator<Follower_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)this_00) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  pcVar3 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  BlackCard::~BlackCard(&this->super_BlackCard);
  return;
}

Assistant:

Personality::~Personality()
{
    list<Follower*>::iterator itf;
    for (itf = followers.begin(); itf != followers.end(); itf++)
    {
        followers.remove((*itf));
        delete *itf;
        itf = followers.begin();
    }

    list<Item*>::iterator iti;
    for (iti = items.begin(); iti != items.end(); iti++)
    {
        items.remove((*iti));
        delete *iti;
        iti = items.begin();
    }
}